

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *__s1;
  ostream *poVar2;
  long in_RSI;
  int in_EDI;
  exception *e;
  int i_1;
  char *libraryVersion;
  int i;
  char *in_stack_000008b0;
  char *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  int local_24;
  int local_14;
  int local_4;
  
  if (in_EDI < 2) {
    usageMessage(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,false);
    local_4 = -1;
  }
  else {
    for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-h");
      if ((iVar1 == 0) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"--help"), iVar1 == 0)) {
        usageMessage(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,false);
        return 0;
      }
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"--version");
      if (iVar1 == 0) {
        __s1 = (char *)Imf_3_2::getLibraryVersion();
        poVar2 = std::operator<<((ostream *)&std::cout,"exrheader (OpenEXR) ");
        std::operator<<(poVar2,"3.2.0");
        iVar1 = strcmp(__s1,"3.2.0");
        if (iVar1 != 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
          poVar2 = std::operator<<(poVar2,__s1);
          std::operator<<(poVar2,")");
        }
        poVar2 = std::operator<<((ostream *)&std::cout," https://openexr.com");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Copyright (c) Contributors to the OpenEXR Project");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        return 0;
      }
    }
    for (local_24 = 1; local_24 < in_EDI; local_24 = local_24 + 1) {
      printInfo(in_stack_000008b0);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp (argv[i], "-h") || !strcmp(argv[1], "--help"))
        {
            usageMessage (cout, "exrheader", true);
            return 0;
        }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion();
            
            cout << "exrheader (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;
            return 0;
        }
    }

    try
    {
        for (int i = 1; i < argc; ++i)
            printInfo (argv[i]);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}